

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<unsigned_short,_unsigned_int,_bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
::IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>::Advance
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_> *this)

{
  _Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false> *this_00;
  __uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  _Var1;
  bool bVar2;
  unique_ptr<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
  uVar3;
  
  bVar2 = AtEnd(this);
  if (!bVar2) {
    (**(code **)(*(long *)(this->current_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                          .
                          super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                          .
                          super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
                          ._M_head_impl.impl_._M_t + 0x18))();
    bVar2 = ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>::
            operator==((ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                        *)&this->current_,
                       (ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>
                        *)&this->end_);
    if (bVar2) {
      uVar3._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>,_true,_true>
            )(**(code **)(*(long *)(this->begin_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                                   .
                                   super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
                                   ._M_head_impl.impl_._M_t + 0x20))();
      _Var1._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
      ._M_head_impl =
           *(tuple<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
             *)&(this->current_).
                super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                .
                super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                .
                super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                .
                super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
                ._M_head_impl.impl_._M_t;
      (this->current_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
      .
      super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
      .
      super__Tuple_impl<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
      .
      super__Head_base<2UL,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_false>
      ._M_head_impl.impl_._M_t =
           uVar3._M_t.
           super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
           ._M_head_impl;
      if ((__uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
           )_Var1._M_t.
            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
            .
            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
           )0x0) {
        (**(code **)(*(long *)_Var1._M_t.
                              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>_>
                              .
                              super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_*,_false>
                              ._M_head_impl + 8))();
      }
      this_00 = &(this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                 .
                 super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                 .super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>;
      (**(code **)(*(long *)(this->current_).
                            super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                            .
                            super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                            .
                            super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>
                            ._M_head_impl.impl_._M_t.
                            super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_int>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_int>_>_>
                            .
                            super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_int>_*,_false>
                  + 0x18))();
      bVar2 = ParamIterator<unsigned_int>::operator!=
                        (&this_00->_M_head_impl,
                         &(this->end_).
                          super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                          .
                          super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                          .
                          super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>
                          ._M_head_impl);
      if (!bVar2) {
        ParamIterator<unsigned_int>::operator=
                  (&this_00->_M_head_impl,
                   &(this->begin_).
                    super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                    .super__Head_base<1UL,_testing::internal::ParamIterator<unsigned_int>,_false>.
                    _M_head_impl);
        (**(code **)(*(long *)(this->current_).
                              super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                              .
                              super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_short>,_false>
                              ._M_head_impl.impl_._M_t.
                              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<unsigned_short>,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_std::default_delete<testing::internal::ParamIteratorInterface<unsigned_short>_>_>
                              .
                              super__Head_base<0UL,_testing::internal::ParamIteratorInterface<unsigned_short>_*,_false>
                    + 0x18))();
        ParamIterator<unsigned_short>::operator!=
                  (&(this->current_).
                    super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                    .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_short>,_false>.
                    _M_head_impl,
                   &(this->end_).
                    super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_short>,_testing::internal::ParamIterator<unsigned_int>,_testing::internal::ParamIterator<bssl::(anonymous_namespace)::ssl_test_ticket_aead_failure_mode>_>
                    .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_short>,_false>.
                    _M_head_impl);
      }
    }
    ComputeCurrentValue(this);
    return;
  }
  __assert_fail("!AtEnd()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                ,0x361,
                "virtual void testing::internal::CartesianProductGenerator<unsigned short, unsigned int, bssl::(anonymous namespace)::ssl_test_ticket_aead_failure_mode>::IteratorImpl<std::integer_sequence<unsigned long, 0, 1, 2>>::Advance() [T = <unsigned short, unsigned int, bssl::(anonymous namespace)::ssl_test_ticket_aead_failure_mode>, I = std::integer_sequence<unsigned long, 0, 1, 2>]"
               );
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }